

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int js_obj_to_desc(JSContext *ctx,JSPropertyDescriptor *d,JSValue desc)

{
  int iVar1;
  uint uVar2;
  JSValueUnion JVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong unaff_R15;
  JSValue JVar7;
  JSValue JVar8;
  JSValue JVar9;
  uint local_7c;
  int64_t local_70;
  int64_t local_68;
  JSValueUnion local_60;
  JSValueUnion local_58;
  char *local_50;
  ulong local_48;
  int64_t local_40;
  JSValueUnion local_38;
  
  if ((int)desc.tag != -1) {
    JS_ThrowTypeError(ctx,"not an object");
    return -1;
  }
  iVar1 = JS_HasProperty(ctx,desc,0x3d);
  if (iVar1 == 0) {
    uVar4 = 0;
  }
  else {
    JVar7 = JS_GetPropertyInternal(ctx,desc,0x3d,desc,0);
    unaff_R15 = (ulong)(uint)JVar7.tag;
    uVar4 = 0;
    if (unaff_R15 != 6) {
      iVar1 = JS_ToBoolFree(ctx,JVar7);
      uVar4 = (ulong)(0x101 - (iVar1 == 0));
    }
    if ((uint)JVar7.tag == 6) {
      local_68 = 3;
      uVar6 = 0;
      uVar4 = 0;
      local_70 = 3;
      uVar5 = 0;
      local_48 = 0;
      JVar8 = (JSValue)(ZEXT816(3) << 0x40);
      goto LAB_0014747d;
    }
  }
  iVar1 = JS_HasProperty(ctx,desc,0x3e);
  if (iVar1 != 0) {
    JVar7 = JS_GetPropertyInternal(ctx,desc,0x3e,desc,0);
    unaff_R15 = (ulong)(uint)JVar7.tag;
    if (unaff_R15 != 6) {
      iVar1 = JS_ToBoolFree(ctx,JVar7);
      uVar4 = (ulong)((uint)(iVar1 != 0) * 2 | (uint)uVar4 | 0x200);
    }
    if ((uint)JVar7.tag != 6) goto LAB_001475c6;
LAB_001475a4:
    uVar6 = 0;
    local_68 = 3;
    uVar4 = 0;
    local_70 = 3;
    uVar5 = 0;
    local_48 = 0;
    JVar8 = (JSValue)(ZEXT816(3) << 0x40);
    goto LAB_0014747d;
  }
LAB_001475c6:
  iVar1 = JS_HasProperty(ctx,desc,0x3f);
  if (iVar1 != 0) {
    JVar7 = JS_GetPropertyInternal(ctx,desc,0x3f,desc,0);
    unaff_R15 = (ulong)(uint)JVar7.tag;
    if (unaff_R15 != 6) {
      iVar1 = JS_ToBoolFree(ctx,JVar7);
      uVar4 = (ulong)((uint)(iVar1 != 0) << 2 | (uint)uVar4 | 0x400);
    }
    if ((uint)JVar7.tag == 6) goto LAB_001475a4;
  }
  local_7c = (uint)uVar4;
  iVar1 = JS_HasProperty(ctx,desc,0x40);
  JVar7 = (JSValue)(ZEXT816(3) << 0x40);
  if (iVar1 == 0) {
    JVar8 = (JSValue)(ZEXT816(3) << 0x40);
  }
  else {
    JVar8 = JS_GetPropertyInternal(ctx,desc,0x40,desc,0);
    unaff_R15 = (ulong)JVar8.u.ptr >> 0x20;
    if ((int)JVar8.tag == 6) {
      local_68 = 3;
      uVar6 = 0;
      uVar4 = 0;
      local_70 = 3;
      uVar5 = 0;
      local_48 = 0;
      goto LAB_0014747d;
    }
    local_7c = local_7c | 0x2000;
  }
  local_40 = JVar8.tag;
  local_38 = JVar8.u;
  uVar2 = JS_HasProperty(ctx,desc,0x41);
  local_48 = (ulong)uVar2;
  if (uVar2 == 0) {
LAB_001477ab:
    local_70 = JVar7.tag;
    local_58 = JVar7.u;
    iVar1 = JS_HasProperty(ctx,desc,0x42);
    if (iVar1 == 0) {
      JVar9 = (JSValue)(ZEXT816(3) << 0x40);
    }
    else {
      local_7c = local_7c | 0x1000;
      JVar9 = JS_GetPropertyInternal(ctx,desc,0x42,desc,0);
      uVar4 = (ulong)JVar9.u.ptr >> 0x20;
      if (((int)JVar9.tag != 3) &&
         ((local_50 = "invalid setter", (int)JVar9.tag == 6 ||
          (iVar1 = JS_IsFunction(ctx,JVar9), iVar1 == 0)))) goto LAB_00147767;
    }
    local_68 = JVar9.tag;
    local_60 = JVar9.u;
    if ((local_7c & 0x1800) == 0 || (local_7c & 0x2200) == 0) {
      d->flags = local_7c;
      (d->value).u.ptr = (void *)((ulong)local_38.ptr & 0xffffffff | unaff_R15 << 0x20);
      (d->value).tag = local_40;
      (d->getter).u.ptr = (void *)((ulong)local_58.ptr & 0xffffffff | local_48 << 0x20);
      (d->getter).tag = local_70;
      (d->setter).u.ptr = (void *)((ulong)local_60.ptr & 0xffffffff | uVar4 << 0x20);
      (d->setter).tag = local_68;
      return 0;
    }
    local_50 = "cannot have setter/getter and value or writable";
  }
  else {
    JVar7 = JS_GetPropertyInternal(ctx,desc,0x41,desc,0);
    local_48 = (ulong)JVar7.u.ptr >> 0x20;
    local_50 = "invalid getter";
    JVar9 = (JSValue)(ZEXT816(3) << 0x40);
    if (((int)JVar7.tag != 6) &&
       ((local_7c = local_7c | 0x800, (int)JVar7.tag == 3 ||
        (iVar1 = JS_IsFunction(ctx,JVar7), JVar9 = (JSValue)(ZEXT816(3) << 0x40), iVar1 != 0))))
    goto LAB_001477ab;
  }
LAB_00147767:
  local_70 = JVar7.tag;
  local_58 = JVar7.u;
  local_68 = JVar9.tag;
  local_60 = JVar9.u;
  JS_ThrowTypeError(ctx,local_50);
  local_48 = local_48 << 0x20;
  uVar5 = (ulong)local_58.ptr & 0xffffffff;
  uVar4 = uVar4 << 0x20;
  uVar6 = (ulong)local_60.ptr & 0xffffffff;
LAB_0014747d:
  JVar7.tag = JVar8.tag;
  JVar3.ptr = (void *)((ulong)JVar8.u.ptr & 0xffffffff | unaff_R15 << 0x20);
  if ((0xfffffff4 < (uint)JVar8.tag) &&
     (iVar1 = *JVar3.ptr, *(int *)JVar3.ptr = iVar1 + -1, iVar1 < 2)) {
    JVar7.u.ptr = JVar3.ptr;
    __JS_FreeValueRT(ctx->rt,JVar7);
  }
  JVar3.ptr = (void *)(local_48 | uVar5);
  if ((0xfffffff4 < (uint)local_70) &&
     (iVar1 = *JVar3.ptr, *(int *)JVar3.ptr = iVar1 + -1, iVar1 < 2)) {
    JVar8.tag = local_70;
    JVar8.u.ptr = JVar3.ptr;
    __JS_FreeValueRT(ctx->rt,JVar8);
  }
  JVar3.ptr = (void *)(uVar4 | uVar6);
  if ((0xfffffff4 < (uint)local_68) &&
     (iVar1 = *JVar3.ptr, *(int *)JVar3.ptr = iVar1 + -1, iVar1 < 2)) {
    JVar9.tag = local_68;
    JVar9.u.ptr = JVar3.ptr;
    __JS_FreeValueRT(ctx->rt,JVar9);
  }
  return -1;
}

Assistant:

static int js_obj_to_desc(JSContext *ctx, JSPropertyDescriptor *d,
                          JSValueConst desc)
{
    JSValue val, getter, setter;
    int flags;

    if (!JS_IsObject(desc)) {
        JS_ThrowTypeErrorNotAnObject(ctx);
        return -1;
    }
    flags = 0;
    val = JS_UNDEFINED;
    getter = JS_UNDEFINED;
    setter = JS_UNDEFINED;
    if (JS_HasProperty(ctx, desc, JS_ATOM_configurable)) {
        JSValue prop = JS_GetProperty(ctx, desc, JS_ATOM_configurable);
        if (JS_IsException(prop))
            goto fail;
        flags |= JS_PROP_HAS_CONFIGURABLE;
        if (JS_ToBoolFree(ctx, prop))
            flags |= JS_PROP_CONFIGURABLE;
    }
    if (JS_HasProperty(ctx, desc, JS_ATOM_writable)) {
        JSValue prop = JS_GetProperty(ctx, desc, JS_ATOM_writable);
        if (JS_IsException(prop))
            goto fail;
        flags |= JS_PROP_HAS_WRITABLE;
        if (JS_ToBoolFree(ctx, prop))
            flags |= JS_PROP_WRITABLE;
    }
    if (JS_HasProperty(ctx, desc, JS_ATOM_enumerable)) {
        JSValue prop = JS_GetProperty(ctx, desc, JS_ATOM_enumerable);
        if (JS_IsException(prop))
            goto fail;
        flags |= JS_PROP_HAS_ENUMERABLE;
        if (JS_ToBoolFree(ctx, prop))
            flags |= JS_PROP_ENUMERABLE;
    }
    if (JS_HasProperty(ctx, desc, JS_ATOM_value)) {
        flags |= JS_PROP_HAS_VALUE;
        val = JS_GetProperty(ctx, desc, JS_ATOM_value);
        if (JS_IsException(val))
            goto fail;
    }
    if (JS_HasProperty(ctx, desc, JS_ATOM_get)) {
        flags |= JS_PROP_HAS_GET;
        getter = JS_GetProperty(ctx, desc, JS_ATOM_get);
        if (JS_IsException(getter) ||
            !(JS_IsUndefined(getter) || JS_IsFunction(ctx, getter))) {
            JS_ThrowTypeError(ctx, "invalid getter");
            goto fail;
        }
    }
    if (JS_HasProperty(ctx, desc, JS_ATOM_set)) {
        flags |= JS_PROP_HAS_SET;
        setter = JS_GetProperty(ctx, desc, JS_ATOM_set);
        if (JS_IsException(setter) ||
            !(JS_IsUndefined(setter) || JS_IsFunction(ctx, setter))) {
            JS_ThrowTypeError(ctx, "invalid setter");
            goto fail;
        }
    }
    if ((flags & (JS_PROP_HAS_SET | JS_PROP_HAS_GET)) &&
        (flags & (JS_PROP_HAS_VALUE | JS_PROP_HAS_WRITABLE))) {
        JS_ThrowTypeError(ctx, "cannot have setter/getter and value or writable");
        goto fail;
    }
    d->flags = flags;
    d->value = val;
    d->getter = getter;
    d->setter = setter;
    return 0;
 fail:
    JS_FreeValue(ctx, val);
    JS_FreeValue(ctx, getter);
    JS_FreeValue(ctx, setter);
    return -1;
}